

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O0

void __thiscall
sznet::net::InetAddress::InetAddress(InetAddress *this,uint16_t port,bool loopbackOnly,bool ipv6)

{
  undefined8 uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  undefined8 *local_38;
  in_addr_t ip_1;
  in6_addr ip;
  bool ipv6_local;
  bool loopbackOnly_local;
  uint16_t port_local;
  InetAddress *this_local;
  
  if (ipv6) {
    memset(this,0,0x1c);
    (this->field_0).m_addr.sin_family = 10;
    if (loopbackOnly) {
      local_38 = (undefined8 *)&in6addr_loopback;
    }
    else {
      local_38 = (undefined8 *)&in6addr_any;
    }
    uVar1 = local_38[1];
    *(undefined8 *)((long)&this->field_0 + 8) = *local_38;
    *(undefined8 *)((long)&this->field_0 + 0x10) = uVar1;
    uVar2 = sockets::hostToNetwork16(port);
    (this->field_0).m_addr.sin_port = uVar2;
  }
  else {
    memset(this,0,0x10);
    (this->field_0).m_addr.sin_family = 2;
    uVar3 = 0;
    if (loopbackOnly) {
      uVar3 = 0x7f000001;
    }
    uVar3 = sockets::hostToNetwork32(uVar3);
    (this->field_0).m_addr6.sin6_flowinfo = uVar3;
    uVar2 = sockets::hostToNetwork16(port);
    (this->field_0).m_addr.sin_port = uVar2;
  }
  return;
}

Assistant:

InetAddress::InetAddress(uint16_t port, bool loopbackOnly, bool ipv6)
{
	static_assert(offsetof(InetAddress, m_addr6) == 0, "m_addr6 offset 0");
	static_assert(offsetof(InetAddress, m_addr) == 0, "m_addr offset 0");
	if (ipv6)
	{
		memset(&m_addr6, 0, sizeof(m_addr6));
		m_addr6.sin6_family = AF_INET6;
		in6_addr ip = loopbackOnly ? in6addr_loopback : in6addr_any;
		m_addr6.sin6_addr = ip;
		m_addr6.sin6_port = sockets::hostToNetwork16(port);
	}
	else
	{
		memset(&m_addr, 0, sizeof(m_addr));
		m_addr.sin_family = AF_INET;
		auto ip = loopbackOnly ? INADDR_LOOPBACK : INADDR_ANY;
		m_addr.sin_addr.s_addr = sockets::hostToNetwork32(ip);
		m_addr.sin_port = sockets::hostToNetwork16(port);
	}
}